

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<tcu::Vector<float,_2>_> __thiscall
vkt::shaderexecutor::Functions::getComponent<tcu::Matrix<float,2,2>>
          (Functions *this,ExprP<tcu::Matrix<float,_2,_2>_> *container,int ndx)

{
  deInt32 *pdVar1;
  Expr<int> *ptr;
  Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Matrix<float,_2,_2>,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *func;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  ExprP<tcu::Vector<float,_2>_> EVar3;
  ExprP<int> local_28;
  SharedPtrStateBase *pSVar2;
  
  ptr = (Expr<int> *)operator_new(0x10);
  (ptr->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00d06f88;
  *(int *)&ptr[1].super_ExprBase._vptr_ExprBase = ndx;
  exprP<int>((shaderexecutor *)&local_28,ptr);
  voidP();
  voidP();
  func = (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Matrix<float,_2,_2>,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *)instance<vkt::shaderexecutor::Functions::GetComponent<tcu::Matrix<float,2,2>>>();
  EVar3 = createApply<vkt::shaderexecutor::Signature<tcu::Vector<float,2>,tcu::Matrix<float,2,2>,int,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                    ((shaderexecutor *)this,func,container,&local_28,&voidP::singleton,
                     &voidP::singleton);
  pSVar2 = EVar3.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_state;
  if (local_28.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.
              m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.m_ptr =
           (Expr<int> *)0x0;
      (*(local_28.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar2 = extraout_RDX;
    }
    LOCK();
    pdVar1 = &(local_28.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.
              m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_28.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.m_state
        != (SharedPtrStateBase *)0x0)) {
      (*(local_28.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.
        m_state)->_vptr_SharedPtrStateBase[1])();
      pSVar2 = extraout_RDX_00;
    }
  }
  EVar3.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_state = pSVar2;
  EVar3.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar3.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<typename T::Element> getComponent (const ExprP<T>& container, int ndx)
{
	DE_ASSERT(0 <= ndx && ndx < T::SIZE);
	return app<GetComponent<T> >(container, constant(ndx));
}